

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O2

void __thiscall
QTabBarPrivate::initBasicStyleOption(QTabBarPrivate *this,QStyleOptionTab *option,int tabIndex)

{
  byte *pbVar1;
  State *pSVar2;
  int iVar3;
  Tab *pTVar4;
  bool bVar5;
  ColorRole acr;
  TabPosition TVar6;
  QSize QVar7;
  QSize QVar8;
  QTabWidget *this_00;
  QWidget *pQVar9;
  int iVar10;
  QRect QVar11;
  
  iVar10 = (int)(this->tabList).d.size;
  if (iVar10 <= tabIndex || (tabIndex < 0 || option == (QStyleOptionTab *)0x0)) {
    return;
  }
  pQVar9 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  pTVar4 = (this->tabList).d.ptr[(uint)tabIndex];
  QStyleOption::initFrom(&option->super_QStyleOption,pQVar9);
  pbVar1 = (byte *)((long)&(option->super_QStyleOption).state.
                           super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                           super_QFlagsStorage<QStyle::StateFlag>.i + 1);
  *pbVar1 = *pbVar1 & 0xde;
  QVar11 = QTabBar::tabRect((QTabBar *)pQVar9,tabIndex);
  (option->super_QStyleOption).rect = QVar11;
  iVar3 = this->currentIndex;
  option->row = 0;
  if (this->pressedIndex == tabIndex) {
    pSVar2 = &(option->super_QStyleOption).state;
    *(byte *)&(pSVar2->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
              super_QFlagsStorage<QStyle::StateFlag>.i =
         (byte)(pSVar2->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
               super_QFlagsStorage<QStyle::StateFlag>.i | 4;
  }
  if (iVar3 == tabIndex) {
    pbVar1 = (byte *)((long)&(option->super_QStyleOption).state.
                             super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                             super_QFlagsStorage<QStyle::StateFlag>.i + 1);
    *pbVar1 = *pbVar1 | 0x80;
    bVar5 = QWidget::hasFocus(pQVar9);
    if (bVar5) {
      pbVar1 = (byte *)((long)&(option->super_QStyleOption).state.
                               super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                               super_QFlagsStorage<QStyle::StateFlag>.i + 1);
      *pbVar1 = *pbVar1 | 1;
    }
  }
  if ((pTVar4->field_0xe4 & 1) == 0) {
    pSVar2 = &(option->super_QStyleOption).state;
    *(byte *)&(pSVar2->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
              super_QFlagsStorage<QStyle::StateFlag>.i =
         (byte)(pSVar2->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
               super_QFlagsStorage<QStyle::StateFlag>.i & 0xfe;
  }
  bVar5 = QWidget::isActiveWindow(pQVar9);
  if (bVar5) {
    pbVar1 = (byte *)((long)&(option->super_QStyleOption).state.
                             super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                             super_QFlagsStorage<QStyle::StateFlag>.i + 2);
    *pbVar1 = *pbVar1 | 1;
  }
  if (((this->field_0x2d1 & 2) == 0) &&
     (bVar5 = ::comparesEqual(&(option->super_QStyleOption).rect,
                              (QRect *)&(this->super_QWidgetPrivate).field_0x254), bVar5)) {
    pbVar1 = (byte *)((long)&(option->super_QStyleOption).state.
                             super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                             super_QFlagsStorage<QStyle::StateFlag>.i + 1);
    *pbVar1 = *pbVar1 | 0x20;
  }
  option->shape = this->shape;
  QString::operator=(&option->text,(QString *)pTVar4);
  if ((pTVar4->textColor).cspec != Invalid) {
    acr = QWidget::foregroundRole(pQVar9);
    QPalette::setColor(&(option->super_QStyleOption).palette,acr,&pTVar4->textColor);
  }
  QIcon::operator=(&option->icon,&pTVar4->icon);
  QVar7 = QTabBar::iconSize((QTabBar *)pQVar9);
  option->iconSize = QVar7;
  QVar7.wd.m_i = -1;
  QVar7.ht.m_i = -1;
  QVar8 = QVar7;
  if (pTVar4->leftWidget != (QWidget *)0x0) {
    QVar8 = QWidget::size(pTVar4->leftWidget);
  }
  option->leftButtonSize = QVar8;
  if (pTVar4->rightWidget != (QWidget *)0x0) {
    QVar7 = QWidget::size(pTVar4->rightWidget);
  }
  option->rightButtonSize = QVar7;
  option->documentMode = (bool)((byte)((ushort)*(undefined2 *)&this->field_0x2d0 >> 10) & 1);
  if (tabIndex + -1 == this->currentIndex && tabIndex != 0) {
    option->selectedPosition = PreviousIsSelected;
  }
  else if (tabIndex + 1 == this->currentIndex && tabIndex + 1 < iVar10) {
    option->selectedPosition = NextIsSelected;
  }
  else {
    option->selectedPosition = NotAdjacent;
  }
  bVar5 = true;
  if (this->firstVisible == tabIndex) {
LAB_0044ce81:
    TVar6 = OnlyOneTab;
    if (this->lastVisible != tabIndex) {
      if ((this->field_0x2d1 & 2) == 0) {
        if (!bVar5) {
LAB_0044cebe:
          TVar6 = Middle;
          goto LAB_0044cec1;
        }
      }
      else {
        iVar10 = this->pressedIndex + -1;
        if (!bVar5) {
          if (iVar10 != tabIndex) goto LAB_0044cebe;
          goto LAB_0044ce91;
        }
        if (iVar10 == tabIndex) goto LAB_0044cec1;
      }
      TVar6 = Beginning;
      goto LAB_0044cec1;
    }
    if (bVar5) goto LAB_0044cec1;
  }
  else {
    if ((this->field_0x2d1 & 2) != 0) {
      bVar5 = this->pressedIndex + 1 == tabIndex;
      goto LAB_0044ce81;
    }
    if ((this->lastVisible != tabIndex) &&
       ((TVar6 = Middle, (this->field_0x2d1 & 2) == 0 || (this->pressedIndex + -1 != tabIndex))))
    goto LAB_0044cec1;
  }
LAB_0044ce91:
  TVar6 = End;
LAB_0044cec1:
  option->position = TVar6;
  this_00 = QtPrivate::qobject_cast_helper<QTabWidget_const*,QObject>
                      (*(QObject **)(*(long *)&pQVar9->field_0x8 + 0x10));
  if (this_00 != (QTabWidget *)0x0) {
    *(byte *)&(option->features).super_QFlagsStorageHelper<QStyleOptionTab::TabFeature,_4>.
              super_QFlagsStorage<QStyleOptionTab::TabFeature>.i =
         (byte)(option->features).super_QFlagsStorageHelper<QStyleOptionTab::TabFeature,_4>.
               super_QFlagsStorage<QStyleOptionTab::TabFeature>.i | 1;
    pQVar9 = QTabWidget::cornerWidget(this_00,TopLeftCorner);
    if ((pQVar9 != (QWidget *)0x0) ||
       (pQVar9 = QTabWidget::cornerWidget(this_00,BottomLeftCorner), pQVar9 != (QWidget *)0x0)) {
      *(byte *)&(option->cornerWidgets).super_QFlagsStorageHelper<QStyleOptionTab::CornerWidget,_4>.
                super_QFlagsStorage<QStyleOptionTab::CornerWidget>.i =
           (byte)(option->cornerWidgets).super_QFlagsStorageHelper<QStyleOptionTab::CornerWidget,_4>
                 .super_QFlagsStorage<QStyleOptionTab::CornerWidget>.i | 1;
    }
    pQVar9 = QTabWidget::cornerWidget(this_00,TopRightCorner);
    if ((pQVar9 != (QWidget *)0x0) ||
       (pQVar9 = QTabWidget::cornerWidget(this_00,BottomRightCorner), pQVar9 != (QWidget *)0x0)) {
      *(byte *)&(option->cornerWidgets).super_QFlagsStorageHelper<QStyleOptionTab::CornerWidget,_4>.
                super_QFlagsStorage<QStyleOptionTab::CornerWidget>.i =
           (byte)(option->cornerWidgets).super_QFlagsStorageHelper<QStyleOptionTab::CornerWidget,_4>
                 .super_QFlagsStorage<QStyleOptionTab::CornerWidget>.i | 2;
    }
  }
  if ((pTVar4->field_0xe4 & 4) != 0) {
    *(byte *)&(option->features).super_QFlagsStorageHelper<QStyleOptionTab::TabFeature,_4>.
              super_QFlagsStorage<QStyleOptionTab::TabFeature>.i =
         (byte)(option->features).super_QFlagsStorageHelper<QStyleOptionTab::TabFeature,_4>.
               super_QFlagsStorage<QStyleOptionTab::TabFeature>.i | 2;
  }
  option->tabIndex = tabIndex;
  return;
}

Assistant:

void QTabBarPrivate::initBasicStyleOption(QStyleOptionTab *option, int tabIndex) const
{
    Q_Q(const QTabBar);
    const int totalTabs = tabList.size();

    if (!option || (tabIndex < 0 || tabIndex >= totalTabs))
        return;

    const QTabBarPrivate::Tab &tab = *tabList.at(tabIndex);
    option->initFrom(q);
    option->state &= ~(QStyle::State_HasFocus | QStyle::State_MouseOver);
    option->rect = q->tabRect(tabIndex);
    const bool isCurrent = tabIndex == currentIndex;
    option->row = 0;
    if (tabIndex == pressedIndex)
        option->state |= QStyle::State_Sunken;
    if (isCurrent)
        option->state |= QStyle::State_Selected;
    if (isCurrent && q->hasFocus())
        option->state |= QStyle::State_HasFocus;
    if (!tab.enabled)
        option->state &= ~QStyle::State_Enabled;
    if (q->isActiveWindow())
        option->state |= QStyle::State_Active;
    if (!dragInProgress && option->rect == hoverRect)
        option->state |= QStyle::State_MouseOver;
    option->shape = shape;
    option->text = tab.text;

    if (tab.textColor.isValid())
        option->palette.setColor(q->foregroundRole(), tab.textColor);
    option->icon = tab.icon;
    option->iconSize = q->iconSize();  // Will get the default value then.

    option->leftButtonSize = tab.leftWidget ? tab.leftWidget->size() : QSize();
    option->rightButtonSize = tab.rightWidget ? tab.rightWidget->size() : QSize();
    option->documentMode = documentMode;

    if (tabIndex > 0 && tabIndex - 1 == currentIndex)
        option->selectedPosition = QStyleOptionTab::PreviousIsSelected;
    else if (tabIndex + 1 < totalTabs && tabIndex + 1 == currentIndex)
        option->selectedPosition = QStyleOptionTab::NextIsSelected;
    else
        option->selectedPosition = QStyleOptionTab::NotAdjacent;

    const bool paintBeginning = (tabIndex == firstVisible) || (dragInProgress && tabIndex == pressedIndex + 1);
    const bool paintEnd = (tabIndex == lastVisible) || (dragInProgress && tabIndex == pressedIndex - 1);
    if (paintBeginning) {
        if (paintEnd)
            option->position = QStyleOptionTab::OnlyOneTab;
        else
            option->position = QStyleOptionTab::Beginning;
    } else if (paintEnd) {
        option->position = QStyleOptionTab::End;
    } else {
        option->position = QStyleOptionTab::Middle;
    }

#if QT_CONFIG(tabwidget)
    if (const QTabWidget *tw = qobject_cast<const QTabWidget *>(q->parentWidget())) {
        option->features |= QStyleOptionTab::HasFrame;
        if (tw->cornerWidget(Qt::TopLeftCorner) || tw->cornerWidget(Qt::BottomLeftCorner))
            option->cornerWidgets |= QStyleOptionTab::LeftCornerWidget;
        if (tw->cornerWidget(Qt::TopRightCorner) || tw->cornerWidget(Qt::BottomRightCorner))
            option->cornerWidgets |= QStyleOptionTab::RightCornerWidget;
    }
#endif
    if (tab.measuringMinimum)
        option->features |= QStyleOptionTab::MinimumSizeHint;
    option->tabIndex = tabIndex;
}